

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::SetAccessorOrNonWritableProperty
               (Var receiver,RecyclableObject *object,PropertyId propertyId,Var newValue,
               PropertyValueInfo *info,ScriptContext *requestContext,
               PropertyOperationFlags propertyOperationFlags,bool isRoot,
               bool allowUndecInConsoleScope,BOOL *result)

{
  code *pcVar1;
  uint uVar2;
  BOOL BVar3;
  RecyclableObject *pRVar4;
  undefined4 *puVar5;
  UnscopablesWrapperObject *pUVar6;
  JavascriptProxy *this;
  RecyclableObject *object_00;
  bool bVar7;
  undefined8 local_b0;
  PropertyValueInfo receiverInfo;
  Var receiverSetter;
  JavascriptFunction *local_40;
  Var setterValueOrProxy;
  DescriptorFlags flags;
  
  bVar7 = false;
  *result = 0;
  local_40 = (JavascriptFunction *)0x0;
  setterValueOrProxy._4_4_ = 0;
  if ((RecyclableObject *)receiver != object && !isRoot) {
    receiverInfo.inlineCacheIndex = 0;
    receiverInfo.isFunctionPIC = false;
    receiverInfo.allowResizingPolymorphicInlineCache = false;
    receiverInfo._62_2_ = 0;
    local_b0 = 0;
    receiverInfo.m_instance = (RecyclableObject *)0x50000ffff;
    receiverInfo.m_propertyIndex = 0;
    receiverInfo.m_attributes = '\0';
    receiverInfo.flags = InlineCacheNoFlags;
    receiverInfo.cacheInfoFlag = 0;
    receiverInfo.inlineCache = (InlineCache *)0x0;
    receiverInfo.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    receiverInfo.functionBody = (FunctionBody *)0x0;
    receiverInfo.prop = (RecyclableObject *)0x0;
    receiverInfo.propertyRecordUsageCache._0_4_ = 0xffffffff;
    receiverInfo.propertyRecordUsageCache._5_1_ = 1;
    pRVar4 = VarTo<Js::RecyclableObject>(receiver);
    uVar2 = (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x10])
                      (pRVar4,(ulong)(uint)propertyId,&receiverInfo.inlineCacheIndex,&local_b0,
                       requestContext);
    bVar7 = (uVar2 & 6) == 2;
  }
  if (isRoot) {
    BVar3 = CheckPrototypesForAccessorOrNonWritableRootProperty
                      (object,propertyId,&local_40,
                       (DescriptorFlags *)((long)&setterValueOrProxy + 4),info,requestContext);
    if (BVar3 == 0) {
      return false;
    }
  }
  else {
    BVar3 = CheckPrototypesForAccessorOrNonWritableProperty
                      (object,propertyId,&local_40,
                       (DescriptorFlags *)((long)&setterValueOrProxy + 4),info,requestContext);
    if ((bool)(~bVar7 & BVar3 == 0)) {
      return false;
    }
  }
  if ((setterValueOrProxy._4_4_ & 1) == 0) {
    if ((setterValueOrProxy._4_4_ & 0x10) == 0) {
      if (!bVar7 && (setterValueOrProxy._4_4_ & 6) != 2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xac6,
                                    "(((flags & Data) == Data && (flags & Writable) == None) || receiverNonWritable)"
                                    ,
                                    "((flags & Data) == Data && (flags & Writable) == None) || receiverNonWritable"
                                   );
        if (!bVar7) {
LAB_00aab4ab:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      if (allowUndecInConsoleScope) {
        return false;
      }
      if ((setterValueOrProxy._4_4_ & 8) != 0) {
        JavascriptError::ThrowTypeError(requestContext,-0x7ff5fbe1,(PCWSTR)0x0);
      }
      JavascriptError::ThrowCantAssign(propertyOperationFlags,requestContext,propertyId);
      JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
      BVar3 = 0;
    }
    else {
      bVar7 = VarIs<Js::JavascriptProxy>(local_40);
      if (!bVar7) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xaba,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                    "VarIs<JavascriptProxy>(setterValueOrProxy)");
        if (!bVar7) goto LAB_00aab4ab;
        *puVar5 = 0;
      }
      this = VarTo<Js::JavascriptProxy>(local_40);
      if (info != (PropertyValueInfo *)0x0) {
        info->m_instance = (RecyclableObject *)this;
        info->m_propertyIndex = 0xffff;
        info->m_attributes = '\0';
        info->flags = InlineCacheNoFlags;
        *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
      }
      BVar3 = JavascriptProxy::SetPropertyTrap
                        (this,receiver,SetPropertyKind,propertyId,newValue,requestContext,
                         propertyOperationFlags,0);
    }
  }
  else {
    bVar7 = JavascriptError::ThrowIfUndefinedSetter
                      (propertyOperationFlags,local_40,requestContext,propertyId);
    BVar3 = 1;
    if ((!bVar7) && (local_40 != (JavascriptFunction *)0x0)) {
      pRVar4 = VarTo<Js::RecyclableObject>(local_40);
      if ((info != (PropertyValueInfo *)0x0) &&
         ((info->flags != InlineCacheSetterFlag && (info->m_propertyIndex != 0xffff)))) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xaa3,
                                    "(!info || info->GetFlags() == InlineCacheSetterFlag || info->GetPropertyIndex() == Constants::NoSlot)"
                                    ,
                                    "!info || info->GetFlags() == InlineCacheSetterFlag || info->GetPropertyIndex() == Constants::NoSlot"
                                   );
        if (!bVar7) goto LAB_00aab4ab;
        *puVar5 = 0;
      }
      bVar7 = VarIs<Js::UnscopablesWrapperObject>(receiver);
      if (bVar7) {
        pUVar6 = UnsafeVarTo<Js::UnscopablesWrapperObject>(receiver);
        receiver = (pUVar6->wrappedObject).ptr;
      }
      else if ((local_40 != (JavascriptFunction *)0x0) &&
              ((((requestContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).defaultAccessorFunction.ptr != local_40)) {
        object_00 = VarTo<Js::RecyclableObject>(receiver);
        CacheOperators::CachePropertyWrite
                  (object_00,isRoot,(object->type).ptr,propertyId,info,requestContext);
      }
      CallSetter(pRVar4,receiver,newValue,requestContext);
      BVar3 = 1;
    }
  }
  *result = BVar3;
  return true;
}

Assistant:

bool JavascriptOperators::SetAccessorOrNonWritableProperty(
        Var receiver,
        RecyclableObject* object,
        PropertyId propertyId,
        Var newValue,
        PropertyValueInfo * info,
        ScriptContext* requestContext,
        PropertyOperationFlags propertyOperationFlags,
        bool isRoot,
        bool allowUndecInConsoleScope,
        BOOL *result)
    {
        *result = FALSE;
        Var setterValueOrProxy = nullptr;
        DescriptorFlags flags = None;
        bool receiverNonWritable = false;

        if (receiver != object && !isRoot)
        {
            Var receiverSetter = nullptr;
            PropertyValueInfo receiverInfo;
            DescriptorFlags receiverFlags = VarTo<RecyclableObject>(receiver)->GetSetter(propertyId, &receiverSetter, &receiverInfo, requestContext);
            receiverNonWritable = ((receiverFlags & Data) == Data && (receiverFlags & Writable) == None);
        }

        if ((isRoot && JavascriptOperators::CheckPrototypesForAccessorOrNonWritableRootProperty(object, propertyId, &setterValueOrProxy, &flags, info, requestContext)) ||
            (!isRoot && (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableProperty(object, propertyId, &setterValueOrProxy, &flags, info, requestContext) ||
            receiverNonWritable)))
        {
            if ((flags & Accessor) == Accessor)
            {
                if (JavascriptError::ThrowIfUndefinedSetter(propertyOperationFlags, setterValueOrProxy, requestContext, propertyId))
                {
                    *result = TRUE;
                    return true;
                }
                if (setterValueOrProxy)
                {
                    RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);
                    Assert(!info || info->GetFlags() == InlineCacheSetterFlag || info->GetPropertyIndex() == Constants::NoSlot);

                    if (VarIs<UnscopablesWrapperObject>(receiver))
                    {
                        receiver = (UnsafeVarTo<UnscopablesWrapperObject>(receiver))->GetWrappedObject();
                    }
                    else if (!JavascriptOperators::IsUndefinedAccessor(setterValueOrProxy, requestContext))
                    {
                        CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), isRoot, object->GetType(), propertyId, info, requestContext);
                    }
#ifdef ENABLE_MUTATION_BREAKPOINT
                    if (MutationBreakpoint::IsFeatureEnabled(requestContext))
                    {
                        MutationBreakpoint::HandleSetProperty(requestContext, object, propertyId, newValue);
                    }
#endif
                    JavascriptOperators::CallSetter(func, receiver, newValue, requestContext);
                }
                *result = TRUE;
                return true;
            }
            else if ((flags & Proxy) == Proxy)
            {
                Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                // We can't cache the property at this time. both target and handler can be changed outside of the proxy, so the inline cache needs to be
                // invalidate when target, handler, or handler prototype has changed. We don't have a way to achieve this yet.
                PropertyValueInfo::SetNoCache(info, proxy);
                PropertyValueInfo::DisablePrototypeCache(info, proxy); // We can't cache prototype property either

                *result = proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetPropertyKind, propertyId, newValue, requestContext, propertyOperationFlags);
                return true;
            }
            else
            {
                Assert(((flags & Data) == Data && (flags & Writable) == None) || receiverNonWritable);
                if (!allowUndecInConsoleScope)
                {
                    if (flags & Const)
                    {
                        JavascriptError::ThrowTypeError(requestContext, ERRAssignmentToConst);
                    }

                    JavascriptError::ThrowCantAssign(propertyOperationFlags, requestContext, propertyId);
                    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);

                    *result = FALSE;
                    return true;
                }
            }
        }
        return false;
    }